

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  lest lVar2;
  size_type sVar3;
  expected<void,_int> *in_RDX;
  ForNonContainerNonPointer<nonstd::expected_lite::expected<void,_int>,_std::string> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  lest local_50;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  lVar2 = (*(lest **)this)[4];
  to_string<nonstd::expected_lite::expected<void,int>>(&local_90,*(lest **)this,in_RDX);
  sVar3 = local_90._M_string_length;
  paVar1 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar1) {
    local_60._8_4_ = local_90.field_2._8_4_;
    local_60._12_4_ = local_90.field_2._12_4_;
    local_70 = &local_60;
  }
  else {
    local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_90._M_dataplus._M_p;
  }
  local_60._M_allocated_capacity._4_4_ = local_90.field_2._M_allocated_capacity._4_4_;
  local_60._M_allocated_capacity._0_4_ = local_90.field_2._M_allocated_capacity._0_4_;
  local_68 = local_90._M_string_length;
  local_90._M_string_length = 0;
  local_90.field_2._M_allocated_capacity._0_4_ =
       local_90.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  local_50 = lVar2;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,local_70,local_70->_M_local_buf + sVar3);
  __return_storage_ptr__->passed = (bool)local_50;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_48,local_40 + (long)local_48);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT44(local_90.field_2._M_allocated_capacity._4_4_,
                             local_90.field_2._M_allocated_capacity._0_4_) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result{ !!lhs, to_string( lhs ) }; }